

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O2

void __thiscall
blockencodings_tests::TransactionsRequestDeserializationMaxTest::test_method
          (TransactionsRequestDeserializationMaxTest *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  long *plVar2;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  long local_138;
  long local_130;
  char *local_128;
  char *local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined1 *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_d8;
  undefined8 uStack_c0;
  BlockTransactionsRequest req1;
  uint256 local_78;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RandomMixin<FastRandomContext>::rand256
            (&local_78,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_rng.super_RandomMixin<FastRandomContext>);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_58,1);
  *local_58._M_impl.super__Vector_impl_data._M_start = 0xffff;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_c0 = 0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BlockTransactionsRequest::
  SerializationOps<DataStream,BlockTransactionsRequest_const,ActionSerialize>();
  req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BlockTransactionsRequest::SerializationOps<DataStream,BlockTransactionsRequest,ActionUnserialize>
            (&req1,&local_d8);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x187;
  file.m_begin = (iterator)&local_e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_01139f30;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_120 = "";
  local_130 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58._M_impl.super__Vector_impl_data._M_start >> 1;
  plVar2 = &local_130;
  local_138 = (long)req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 1;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_118,&local_128,0x187,1,2,plVar2,"req0.indexes.size()",&local_138,
             "req1.indexes.size()");
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)plVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0x188;
  file_00.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_158,
             msg_00);
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_01139f30;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_160 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
            (&local_118,&local_168,0x188,1,2,local_58._M_impl.super__Vector_impl_data._M_start,
             "req0.indexes[0]",
             req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start,"req1.indexes[0]");
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_d8);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(TransactionsRequestDeserializationMaxTest) {
    // Check that the highest legal index is decoded correctly
    BlockTransactionsRequest req0;
    req0.blockhash = m_rng.rand256();
    req0.indexes.resize(1);
    req0.indexes[0] = 0xffff;
    DataStream stream{};
    stream << req0;

    BlockTransactionsRequest req1;
    stream >> req1;
    BOOST_CHECK_EQUAL(req0.indexes.size(), req1.indexes.size());
    BOOST_CHECK_EQUAL(req0.indexes[0], req1.indexes[0]);
}